

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

pair<unsigned_long,_unsigned_long> httplib::detail::trim(char *b,char *e,size_t left,size_t right)

{
  pair<unsigned_long,_unsigned_long> pVar1;
  bool local_3a;
  bool local_39;
  size_t local_38;
  size_t right_local;
  size_t left_local;
  char *e_local;
  char *b_local;
  
  local_38 = right;
  right_local = left;
  left_local = (size_t)e;
  e_local = b;
  while( true ) {
    local_39 = false;
    if (e_local + right_local < left_local) {
      local_39 = is_space_or_tab(e_local[right_local]);
    }
    if (local_39 == false) break;
    right_local = right_local + 1;
  }
  while( true ) {
    local_3a = false;
    if (local_38 != 0) {
      local_3a = is_space_or_tab(e_local[local_38 - 1]);
    }
    if (local_3a == false) break;
    local_38 = local_38 - 1;
  }
  pVar1 = std::make_pair<unsigned_long&,unsigned_long&>(&right_local,&local_38);
  return pVar1;
}

Assistant:

inline std::pair<size_t, size_t> trim(const char *b, const char *e, size_t left,
											  size_t right) {
			while (b + left < e && is_space_or_tab(b[left])) {
				left++;
			}
			while (right > 0 && is_space_or_tab(b[right - 1])) {
				right--;
			}
			return std::make_pair(left, right);
		}